

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  AbsPositiveUpperPrinterFactory *this;
  AbsNegativeLowerPrinterFactory *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  this = (AbsPositiveUpperPrinterFactory *)operator_new(8);
  AbsPositiveUpperPrinterFactory::AbsPositiveUpperPrinterFactory(this);
  this_00 = (AbsNegativeLowerPrinterFactory *)operator_new(8);
  AbsNegativeLowerPrinterFactory::AbsNegativeLowerPrinterFactory(this_00);
  iVar1 = (*(this->super_AbsPrinterFactory)._vptr_AbsPrinterFactory[2])(this);
  iVar2 = (*(this->super_AbsPrinterFactory)._vptr_AbsPrinterFactory[3])(this);
  iVar3 = (*(this_00->super_AbsPrinterFactory)._vptr_AbsPrinterFactory[2])(this_00);
  iVar4 = (*(this_00->super_AbsPrinterFactory)._vptr_AbsPrinterFactory[3])(this_00);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x10))((long *)CONCAT44(extraout_var,iVar1));
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x10))
            ((long *)CONCAT44(extraout_var_00,iVar2));
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x10))
            ((long *)CONCAT44(extraout_var_01,iVar3));
  (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x10))
            ((long *)CONCAT44(extraout_var_02,iVar4));
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	AbsPrinterFactory *positiveUpperFactory = new AbsPositiveUpperPrinterFactory();
	AbsPrinterFactory *negativeLowerFactory = new AbsNegativeLowerPrinterFactory();

	AbsFloatPrinterProduct *p1 = positiveUpperFactory->createFloatProduct();
	AbsCharPrinterProduct *p2 = positiveUpperFactory->createCharProduct();

	AbsFloatPrinterProduct *p3 = negativeLowerFactory->createFloatProduct();
	AbsCharPrinterProduct *p4 = negativeLowerFactory->createCharProduct();

	p1->printFloatMessage();
	p2->printCharMessage();
	p3->printFloatMessage();
	p4->printCharMessage();

	return 0;
}